

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlPatternPtr xmlPatterncompile(xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces)

{
  bool bVar1;
  xmlChar *cur_00;
  xmlPatternPtr pxVar2;
  int iVar3;
  xmlPatternPtr comp;
  bool bVar4;
  uint local_64;
  int streamable;
  int type;
  xmlChar *tmp;
  xmlChar *start;
  xmlChar *or;
  xmlPatParserContextPtr ctxt;
  xmlPatternPtr cur;
  xmlPatternPtr ret;
  xmlChar **namespaces_local;
  int flags_local;
  xmlDict *dict_local;
  xmlChar *pattern_local;
  
  cur = (xmlPatternPtr)0x0;
  local_64 = 0;
  bVar1 = true;
  start = pattern;
  if (pattern == (xmlChar *)0x0) {
    pattern_local = (xmlChar *)0x0;
  }
  else {
    while (cur_00 = start, or = (xmlChar *)0x0, *start != '\0') {
      _streamable = (xmlChar *)0x0;
      while( true ) {
        bVar4 = false;
        if (*start != '\0') {
          bVar4 = *start != '|';
        }
        if (!bVar4) break;
        start = start + 1;
      }
      if (*start == '\0') {
        or = (xmlChar *)xmlNewPatParserContext(cur_00,dict,namespaces);
      }
      else {
        _streamable = xmlStrndup(cur_00,(int)start - (int)cur_00);
        if (_streamable != (xmlChar *)0x0) {
          or = (xmlChar *)xmlNewPatParserContext(_streamable,dict,namespaces);
        }
        start = start + 1;
      }
      if ((or == (xmlChar *)0x0) || (comp = xmlNewPattern(), comp == (xmlPatternPtr)0x0)) {
LAB_001930f0:
        if (or != (xmlChar *)0x0) {
          xmlFreePatParserContext((xmlPatParserContextPtr)or);
        }
        if (cur != (xmlPatternPtr)0x0) {
          xmlFreePattern(cur);
        }
        if (_streamable != (xmlChar *)0x0) {
          (*xmlFree)(_streamable);
        }
        return (xmlPatternPtr)0x0;
      }
      if (dict != (xmlDict *)0x0) {
        comp->dict = dict;
        xmlDictReference(dict);
      }
      pxVar2 = comp;
      if (cur != (xmlPatternPtr)0x0) {
        comp->next = cur->next;
        cur->next = comp;
        pxVar2 = cur;
      }
      cur = pxVar2;
      comp->flags = flags;
      *(xmlPatternPtr *)(or + 0x20) = comp;
      if ((comp->flags & 6U) == 0) {
        xmlCompilePathPattern((xmlPatParserContextPtr)or);
      }
      else {
        xmlCompileIDCXPathPath((xmlPatParserContextPtr)or);
      }
      if (*(int *)(or + 0x10) != 0) goto LAB_001930f0;
      xmlFreePatParserContext((xmlPatParserContextPtr)or);
      or = (xmlChar *)0x0;
      if (bVar1) {
        if (local_64 == 0) {
          local_64 = comp->flags & 0x300;
        }
        else if (local_64 == 0x100) {
          if ((comp->flags & 0x200U) != 0) {
            bVar1 = false;
          }
        }
        else if ((local_64 == 0x200) && ((comp->flags & 0x100U) != 0)) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        xmlStreamCompile(comp);
      }
      iVar3 = xmlReversePattern(comp);
      if (iVar3 < 0) goto LAB_001930f0;
      if (_streamable != (xmlChar *)0x0) {
        (*xmlFree)(_streamable);
      }
    }
    if (!bVar1) {
      for (ctxt = (xmlPatParserContextPtr)cur; ctxt != (xmlPatParserContextPtr)0x0;
          ctxt = *(xmlPatParserContextPtr *)&ctxt->error) {
        if (*(long *)&ctxt->nb_namespaces != 0) {
          xmlFreeStreamComp(*(xmlStreamCompPtr *)&ctxt->nb_namespaces);
          *(undefined8 *)&ctxt->nb_namespaces = 0;
        }
      }
    }
    pattern_local = (xmlChar *)cur;
  }
  return (xmlPatternPtr)pattern_local;
}

Assistant:

xmlPatternPtr
xmlPatterncompile(const xmlChar *pattern, xmlDict *dict, int flags,
                  const xmlChar **namespaces) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;

    if (pattern == NULL)
        return(NULL);

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) goto error;
	cur = xmlNewPattern();
	if (cur == NULL) goto error;
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0)
	    goto error;
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable)
	    xmlStreamCompile(cur);
	if (xmlReversePattern(cur) < 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    return(ret);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    return(NULL);
}